

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionProductResource,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcConstructionResource *this;
  
  this = (IfcConstructionResource *)operator_new(0x1a0);
  *(undefined ***)&this->field_0x188 = &PTR__Object_007e4a70;
  *(undefined8 *)(this + 1) = 0;
  *(char **)&this[1].field_0x8 = "IfcConstructionProductResource";
  Assimp::IFC::Schema_2x3::IfcConstructionResource::IfcConstructionResource
            (this,&PTR_construction_vtable_24__00877cb0);
  *(undefined ***)this = &PTR__IfcConstructionProductResource_00877ba8;
  *(undefined ***)&this->field_0x188 = &PTR__IfcConstructionProductResource_00877c98;
  *(undefined ***)&this->field_0x88 = &PTR__IfcConstructionProductResource_00877bd0;
  *(undefined ***)&this->field_0x98 = &PTR__IfcConstructionProductResource_00877bf8;
  *(undefined ***)&this->field_0xd0 = &PTR__IfcConstructionProductResource_00877c20;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>).
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcConstructionProductResource_00877c48;
  *(undefined ***)&this->field_0x178 = &PTR__IfcConstructionProductResource_00877c70;
  GenericFill<Assimp::IFC::Schema_2x3::IfcConstructionProductResource>
            (db,params,(IfcConstructionProductResource *)this);
  return (Object *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }